

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::WriteWatchdogPeriodInSeconds(AmpIO *this,double seconds,bool ledDisplay)

{
  BasePort *pBVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)(long)(seconds / 5.208333333333333e-06);
  uVar4 = 1;
  if (1 < uVar2) {
    uVar4 = uVar2;
  }
  uVar2 = 0;
  if (seconds != 0.0) {
    uVar2 = uVar4;
  }
  if (NAN(seconds)) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2 | 0x80000000;
  if ((int)CONCAT71(in_register_00000031,ledDisplay) == 0) {
    uVar4 = uVar2;
  }
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  UNRECOVERED_JUMPTABLE = pBVar1->_vptr_BasePort[0x24];
  iVar3 = (*UNRECOVERED_JUMPTABLE)
                    (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,3,(ulong)uVar4,
                     UNRECOVERED_JUMPTABLE);
  return SUB41(iVar3,0);
}

Assistant:

bool AmpIO::WriteWatchdogPeriodInSeconds(const double seconds, bool ledDisplay)
{
    uint32_t counts;
    if (seconds == 0.0) {
        // Disable watchdog
        counts = 0;
    } else {
        // Use at least one tick just to make sure we don't accidentaly disable;
        // the truth is that the count will be so low that watchdog will
        // continuously trigger.
        counts = static_cast<uint32_t>(seconds/WDOG_ClockPeriod);
        counts = std::max(counts, static_cast<uint32_t>(1));
    }
    if (ledDisplay)
        counts |= 0x80000000;
    return WriteWatchdogPeriod(counts);
}